

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

ExpressionValue * __thiscall
ExpressionValue::operator+
          (ExpressionValue *__return_storage_ptr__,ExpressionValue *this,ExpressionValue *other)

{
  ExpressionValueCombination EVar1;
  int64_t value;
  _anonymous_namespace_ *this_00;
  StringLiteral local_1d8;
  string local_1b8;
  StringLiteral local_198;
  StringLiteral local_178;
  string local_158;
  StringLiteral local_138;
  StringLiteral local_118;
  string local_f8;
  StringLiteral local_d8;
  StringLiteral local_b8;
  string local_88;
  StringLiteral local_68;
  StringLiteral local_48;
  undefined1 local_21;
  ExpressionValue *local_20;
  ExpressionValue *other_local;
  ExpressionValue *this_local;
  ExpressionValue *result;
  
  local_21 = 0;
  local_20 = other;
  other_local = this;
  this_local = __return_storage_ptr__;
  ExpressionValue(__return_storage_ptr__);
  this_00 = (_anonymous_namespace_ *)(ulong)local_20->type;
  EVar1 = getValueCombination(this->type,local_20->type);
  switch(EVar1) {
  case II:
    __return_storage_ptr__->type = Integer;
    (__return_storage_ptr__->field_1).intValue =
         (this->field_1).intValue + (local_20->field_1).intValue;
    break;
  case IF:
    __return_storage_ptr__->type = Float;
    (__return_storage_ptr__->field_1).floatValue =
         (double)(this->field_1).intValue + (local_20->field_1).floatValue;
    break;
  case IS:
    __return_storage_ptr__->type = String;
    (anonymous_namespace)::to_string_abi_cxx11_
              (&local_88,(_anonymous_namespace_ *)this->field_1,value);
    StringLiteral::StringLiteral(&local_68,&local_88);
    StringLiteral::operator+(&local_48,&local_68,&local_20->strValue);
    StringLiteral::operator=(&__return_storage_ptr__->strValue,&local_48);
    StringLiteral::~StringLiteral(&local_48);
    StringLiteral::~StringLiteral(&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    break;
  case FI:
    __return_storage_ptr__->type = Float;
    (__return_storage_ptr__->field_1).floatValue =
         (this->field_1).floatValue + (double)(local_20->field_1).intValue;
    break;
  case FF:
    __return_storage_ptr__->type = Float;
    (__return_storage_ptr__->field_1).floatValue =
         (this->field_1).floatValue + (local_20->field_1).floatValue;
    break;
  case FS:
    __return_storage_ptr__->type = String;
    (anonymous_namespace)::to_string_abi_cxx11_(&local_f8,this_00,(this->field_1).floatValue);
    StringLiteral::StringLiteral(&local_d8,&local_f8);
    StringLiteral::operator+(&local_b8,&local_d8,&local_20->strValue);
    StringLiteral::operator=(&__return_storage_ptr__->strValue,&local_b8);
    StringLiteral::~StringLiteral(&local_b8);
    StringLiteral::~StringLiteral(&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    break;
  case SI:
    __return_storage_ptr__->type = String;
    (anonymous_namespace)::to_string_abi_cxx11_
              (&local_158,(_anonymous_namespace_ *)local_20->field_1,value);
    StringLiteral::StringLiteral(&local_138,&local_158);
    StringLiteral::operator+(&local_118,&this->strValue,&local_138);
    StringLiteral::operator=(&__return_storage_ptr__->strValue,&local_118);
    StringLiteral::~StringLiteral(&local_118);
    StringLiteral::~StringLiteral(&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    break;
  case SF:
    __return_storage_ptr__->type = String;
    (anonymous_namespace)::to_string_abi_cxx11_(&local_1b8,this_00,(local_20->field_1).floatValue);
    StringLiteral::StringLiteral(&local_198,&local_1b8);
    StringLiteral::operator+(&local_178,&this->strValue,&local_198);
    StringLiteral::operator=(&__return_storage_ptr__->strValue,&local_178);
    StringLiteral::~StringLiteral(&local_178);
    StringLiteral::~StringLiteral(&local_198);
    std::__cxx11::string::~string((string *)&local_1b8);
    break;
  case SS:
    __return_storage_ptr__->type = String;
    StringLiteral::operator+(&local_1d8,&this->strValue,&local_20->strValue);
    StringLiteral::operator=(&__return_storage_ptr__->strValue,&local_1d8);
    StringLiteral::~StringLiteral(&local_1d8);
  }
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue ExpressionValue::operator+(const ExpressionValue& other) const
{
	ExpressionValue result;
	switch (getValueCombination(type,other.type))
	{
	case ExpressionValueCombination::II:
		result.type = ExpressionValueType::Integer;
		result.intValue = intValue + other.intValue;
		break;
	case ExpressionValueCombination::FI:
		result.type = ExpressionValueType::Float;
		result.floatValue = floatValue + other.intValue;
		break;
	case ExpressionValueCombination::IF:
		result.type = ExpressionValueType::Float;
		result.floatValue = intValue + other.floatValue;
		break;
	case ExpressionValueCombination::FF:
		result.type = ExpressionValueType::Float;
		result.floatValue = floatValue + other.floatValue;
		break;
	case ExpressionValueCombination::IS:
		result.type = ExpressionValueType::String;
		result.strValue = StringLiteral(to_string(intValue)) + other.strValue;
		break;
	case ExpressionValueCombination::FS:
		result.type = ExpressionValueType::String;
		result.strValue = StringLiteral(to_string(floatValue)) + other.strValue;
		break;
	case ExpressionValueCombination::SI:
		result.type = ExpressionValueType::String;
		result.strValue = strValue + to_string(other.intValue);
		break;
	case ExpressionValueCombination::SF:
		result.type = ExpressionValueType::String;
		result.strValue = strValue + to_string(other.floatValue);
		break;
	case ExpressionValueCombination::SS:
		result.type = ExpressionValueType::String;
		result.strValue = strValue + other.strValue;
		break;
	}

	return result;
}